

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Expression * __thiscall
soul::StructuralParser::parseInPlaceOpExpression
          (StructuralParser *this,bool allowAssignment,Expression *lhs,Op opType)

{
  InPlaceOperator *pIVar1;
  TokenType *args;
  Context local_b0;
  Expression *local_98;
  Expression *rhs;
  CompileMessage local_78;
  undefined1 local_40 [8];
  Context context;
  Op opType_local;
  Expression *lhs_local;
  bool allowAssignment_local;
  StructuralParser *this_local;
  
  context.parentScope._4_4_ = opType;
  getContext((Context *)local_40,this);
  if (!allowAssignment) {
    Errors::inPlaceOperatorMustBeStatement<soul::TokenType&>
              (&local_78,(Errors *)&(this->super_SOULTokeniser).currentType,args);
    AST::Context::throwError((Context *)local_40,&local_78,false);
  }
  rhs = (Expression *)
        Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
        ::skip(&this->super_SOULTokeniser);
  local_98 = parseExpression(this,false);
  getContext(&local_b0,this);
  pIVar1 = allocate<soul::AST::InPlaceOperator,soul::AST::Context,soul::AST::Expression&,soul::AST::Expression&,soul::BinaryOp::Op&>
                     (this,&local_b0,lhs,local_98,(Op *)((long)&context.parentScope + 4));
  AST::Context::~Context(&local_b0);
  AST::Context::~Context((Context *)local_40);
  return &pIVar1->super_Expression;
}

Assistant:

AST::Expression& parseInPlaceOpExpression (bool allowAssignment, AST::Expression& lhs, BinaryOp::Op opType)
    {
        auto context = getContext();

        if (! allowAssignment)
            context.throwError (Errors::inPlaceOperatorMustBeStatement (currentType));

        skip();
        auto& rhs = parseExpression();
        return allocate<AST::InPlaceOperator> (getContext(), lhs, rhs, opType);
    }